

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void __thiscall Simulator::printStatistics(Simulator *this)

{
  undefined8 uVar1;
  long in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  BranchPredictor *in_stack_ffffffffffffffd8;
  
  auVar3 = in_ZMM1._0_16_;
  auVar2 = in_ZMM0._0_16_;
  printf("-------STATISTICS---------\n");
  printf("Number of Cycles: %u\n",(ulong)*(uint *)(in_RDI + 0x19c));
  printf("Number of Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x198));
  auVar2 = vcvtusi2ss_avx512f(auVar2,*(undefined4 *)(in_RDI + 0x19c));
  auVar3 = vcvtusi2ss_avx512f(auVar3,*(undefined4 *)(in_RDI + 0x198));
  auVar4._0_4_ = auVar2._0_4_ / auVar3._0_4_;
  auVar4._4_12_ = auVar2._4_12_;
  auVar3._0_8_ = (double)auVar4._0_4_;
  auVar3._8_8_ = auVar2._8_8_;
  printf("Avg Cycles per Instrcution: %.4f\n");
  printf("Number of JALR Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x1a4));
  printf("Number of JAL Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x1a8));
  printf("Number of LOAD Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x1ac));
  printf("Number of STORE Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x1b0));
  printf("Number of BRANCH Instructions: %u\n",(ulong)*(uint *)(in_RDI + 0x1a0));
  printf("Number of Successful Prediction: %u\n",(ulong)*(uint *)(in_RDI + 0x1b4));
  printf("Number of Unsuccessful Prediction: %u\n",(ulong)*(uint *)(in_RDI + 0x1b8));
  auVar2 = vcvtusi2ss_avx512f(auVar3,*(undefined4 *)(in_RDI + 0x1b4));
  auVar3 = vcvtusi2ss_avx512f(auVar4,*(undefined4 *)(in_RDI + 0x1a0));
  BranchPredictor::getStrategyName_abi_cxx11_(in_stack_ffffffffffffffd8);
  uVar1 = std::__cxx11::string::c_str();
  printf("Branch Prediction Accuracy: %.4f (Using Strategy: %s)\n",
         (double)(auVar2._0_4_ / auVar3._0_4_),uVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  printf("Number of Control Hazards: %u\n",(ulong)*(uint *)(in_RDI + 0x1c0));
  printf("Number of Data Hazards: %u\n",(ulong)*(uint *)(in_RDI + 0x1bc));
  printf("Number of Structural Hazards: %u\n",(ulong)*(uint *)(in_RDI + 0x1c4));
  printf("-----------------------------------\n");
  return;
}

Assistant:

void Simulator::printStatistics() const {
    printf("-------STATISTICS---------\n");
    printf("Number of Cycles: %u\n", history.cycle_count);
    printf("Number of Instructions: %u\n", history.inst_count);
    printf("Avg Cycles per Instrcution: %.4f\n", (float) history.cycle_count / history.inst_count);
    printf("Number of JALR Instructions: %u\n", history.jalr_count);
    printf("Number of JAL Instructions: %u\n", history.jal_count);
    printf("Number of LOAD Instructions: %u\n", history.load_count);
    printf("Number of STORE Instructions: %u\n", history.store_count);
    printf("Number of BRANCH Instructions: %u\n", history.branch_count);
    printf("Number of Successful Prediction: %u\n", history.predicted_success);
    printf("Number of Unsuccessful Prediction: %u\n", history.predicted_unsuccess);
    printf("Branch Prediction Accuracy: %.4f (Using Strategy: %s)\n",
           (float) history.predicted_success / history.branch_count,
           branch_predictor->getStrategyName().c_str());
    printf("Number of Control Hazards: %u\n", this->history.control_hazard_count);
    printf("Number of Data Hazards: %u\n", this->history.data_hazard_count);
    printf("Number of Structural Hazards: %u\n", this->history.structural_hazard_count);
    printf("-----------------------------------\n");
}